

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  byte bVar1;
  pointer paVar2;
  unique_function_record uVar3;
  bool bVar4;
  uint __val;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  type_info *ptVar10;
  handle *phVar11;
  undefined8 *puVar12;
  long *plVar13;
  PyMethodDef *pPVar14;
  object *poVar15;
  PyObject *pPVar16;
  handle hVar17;
  PyObject *pPVar18;
  function_record *pfVar19;
  error_already_set *this_00;
  ushort uVar20;
  ulong *puVar21;
  ulong uVar22;
  PyTypeObject *pPVar23;
  function_record *pfVar24;
  ulong uVar25;
  function_record *pfVar26;
  undefined8 uVar27;
  char cVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  uint __len;
  function_record *pfVar29;
  pointer paVar30;
  uint uVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  ulong __val_00;
  bool bVar33;
  undefined1 auVar34 [16];
  string signatures;
  capsule rec_capsule_2;
  object scope_module;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  function_record *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  cpp_function *local_c0;
  PyBufferProcs *local_b8;
  function_record *local_b0;
  strdup_guard local_a8;
  accessor<pybind11::detail::accessor_policies::str_attr> local_88;
  PyMemberDef *local_68;
  PyGetSetDef *local_60;
  _typeobject *local_58;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar29 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar9 = "";
  if (pfVar29->name != (char *)0x0) {
    pcVar9 = pfVar29->name;
  }
  local_c0 = this;
  local_b8 = (PyBufferProcs *)types;
  local_68 = (PyMemberDef *)unique_rec;
  local_60 = (PyGetSetDef *)args;
  pcVar9 = strdup_guard::operator()(&local_a8,pcVar9);
  pfVar29->name = pcVar9;
  if (pfVar29->doc != (char *)0x0) {
    pcVar9 = strdup_guard::operator()(&local_a8,pfVar29->doc);
    pfVar29->doc = pcVar9;
  }
  paVar30 = (pfVar29->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = *(pointer *)
            ((long)&(pfVar29->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  local_128 = pfVar29;
  if (paVar30 != paVar2) {
    do {
      if (*(char **)paVar30 != (char *)0x0) {
        pcVar9 = strdup_guard::operator()(&local_a8,*(char **)paVar30);
        *(char **)paVar30 = pcVar9;
      }
      if (*(char **)(paVar30 + 8) == (char *)0x0) {
        if (*(long *)(paVar30 + 0x10) != 0) {
          auVar34 = PyObject_Repr(*(undefined8 *)(paVar30 + 0x10));
          if ((PyTypeObject *)auVar34._0_8_ == (PyTypeObject *)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_168._0_8_ = auVar34._0_8_;
          cast<std::__cxx11::string>(&local_100,(pybind11 *)local_168,auVar34._8_8_);
          pcVar9 = strdup_guard::operator()(&local_a8,local_100._M_dataplus._M_p);
          *(char **)(paVar30 + 8) = pcVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                     local_100.field_2._M_local_buf[0]) + 1);
          }
          object::~object((object *)local_168);
        }
      }
      else {
        pcVar9 = strdup_guard::operator()(&local_a8,*(char **)(paVar30 + 8));
        *(char **)(paVar30 + 8) = pcVar9;
      }
      paVar30 = paVar30 + 0x20;
    } while (paVar30 != paVar2);
  }
  pfVar29 = local_128;
  pcVar9 = local_128->name;
  iVar7 = strcmp(pcVar9,"__init__");
  if (iVar7 == 0) {
    uVar20 = 1;
  }
  else {
    iVar7 = strcmp(pcVar9,"__setstate__");
    uVar20 = (ushort)(iVar7 == 0);
  }
  local_58 = (_typeobject *)&pfVar29->args;
  *(ushort *)&pfVar29->field_0x59 = uVar20 | *(ushort *)&pfVar29->field_0x59 & 0xfffe;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  bVar33 = false;
  uVar25 = 0;
  local_b0 = (function_record *)0x0;
  do {
    paVar32 = &local_148.field_2;
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        hVar17.m_ptr = (PyObject *)(&local_b8->bf_getbuffer)[(long)local_b0];
        if ((PyTypeObject *)hVar17.m_ptr == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_168._0_8_ = hVar17.m_ptr;
        ptVar10 = detail::get_type_info((type_index *)local_168,false);
        local_b0 = (function_record *)((long)local_b0 + 1);
        if (ptVar10 == (type_info *)0x0) {
          if (((local_128->field_0x59 & 2) == 0) || (uVar25 != 0)) {
            std::__cxx11::string::string
                      ((string *)local_168,
                       (char *)((long)&((hVar17.m_ptr)->ob_type->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)((hVar17.m_ptr)->ob_type->ob_base).ob_base.ob_refcnt ==
                                      '*')),(allocator *)&local_148);
            detail::clean_type_id((string *)local_168);
            std::__cxx11::string::_M_append((char *)&local_100,local_168._0_8_);
            if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)local_158) {
              operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
            }
            goto LAB_0010cd4c;
          }
          local_88.obj.m_ptr = (local_128->scope).m_ptr;
          local_88.key = "__module__";
          local_88.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          phVar11 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               (&local_88)->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_120,phVar11);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
          puVar21 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_148.field_2._M_allocated_capacity = *puVar21;
            local_148.field_2._8_8_ = puVar12[3];
            local_148._M_dataplus._M_p = (pointer)paVar32;
          }
          else {
            local_148.field_2._M_allocated_capacity = *puVar21;
            local_148._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_148._M_string_length = puVar12[1];
          *puVar12 = puVar21;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          local_50.obj.m_ptr = (local_128->scope).m_ptr;
          local_50.key = "__qualname__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          phVar11 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               (&local_50)->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_e0,phVar11);
          uVar27 = (ternaryfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar32) {
            uVar27 = local_148.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar27 < (ternaryfunc)(local_e0._M_string_length + local_148._M_string_length))
          {
            uVar27 = (ternaryfunc)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              uVar27 = local_e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar27 <
                (ternaryfunc)(local_e0._M_string_length + local_148._M_string_length))
            goto LAB_0010cb51;
            plVar13 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_e0,0,(char *)0x0,
                                         (ulong)local_148._M_dataplus._M_p);
          }
          else {
LAB_0010cb51:
            plVar13 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_148,(ulong)local_e0._M_dataplus._M_p);
          }
          local_168._0_8_ = local_158;
          pPVar23 = (PyTypeObject *)(plVar13 + 2);
          if ((PyTypeObject *)*plVar13 == pPVar23) {
            local_158._0_8_ = (pPVar23->ob_base).ob_base.ob_refcnt;
            local_158._8_8_ = plVar13[3];
          }
          else {
            local_158._0_8_ = (pPVar23->ob_base).ob_base.ob_refcnt;
            local_168._0_8_ = (PyObject *)*plVar13;
          }
          local_168._8_8_ = plVar13[1];
          *plVar13 = (long)pPVar23;
          plVar13[1] = 0;
          *(undefined1 *)&(pPVar23->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_100,local_168._0_8_);
        }
        else {
          pPVar23 = ptVar10->type;
          local_88.key = "__module__";
          local_88.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_88.obj.m_ptr = (PyObject *)pPVar23;
          phVar11 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               (&local_88)->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_120,phVar11);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_120);
          puVar21 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_148.field_2._M_allocated_capacity = *puVar21;
            local_148.field_2._8_8_ = plVar13[3];
            local_148._M_dataplus._M_p = (pointer)paVar32;
          }
          else {
            local_148.field_2._M_allocated_capacity = *puVar21;
            local_148._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_148._M_string_length = plVar13[1];
          *plVar13 = (long)puVar21;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          local_50.key = "__qualname__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_50.obj.m_ptr = (PyObject *)pPVar23;
          phVar11 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               (&local_50)->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_e0,phVar11);
          uVar27 = (ternaryfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar32) {
            uVar27 = local_148.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar27 < (ternaryfunc)(local_e0._M_string_length + local_148._M_string_length))
          {
            uVar27 = (ternaryfunc)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              uVar27 = local_e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar27 <
                (ternaryfunc)(local_e0._M_string_length + local_148._M_string_length))
            goto LAB_0010c9b0;
            plVar13 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_e0,0,(char *)0x0,
                                         (ulong)local_148._M_dataplus._M_p);
          }
          else {
LAB_0010c9b0:
            plVar13 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_148,(ulong)local_e0._M_dataplus._M_p);
          }
          local_168._0_8_ = local_158;
          pPVar23 = (PyTypeObject *)(plVar13 + 2);
          if ((PyTypeObject *)*plVar13 == pPVar23) {
            local_158._0_8_ = (pPVar23->ob_base).ob_base.ob_refcnt;
            local_158._8_8_ = plVar13[3];
          }
          else {
            local_158._0_8_ = (pPVar23->ob_base).ob_base.ob_refcnt;
            local_168._0_8_ = (PyObject *)*plVar13;
          }
          local_168._8_8_ = plVar13[1];
          *plVar13 = (long)pPVar23;
          plVar13[1] = 0;
          *(undefined1 *)&(pPVar23->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_100,local_168._0_8_);
        }
        if ((PyObject *)local_168._0_8_ != (PyObject *)local_158) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        object::~object(&local_50.cache);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar32) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        object::~object(&local_88.cache);
      }
      else {
        if (bVar1 == 0) break;
LAB_0010c859:
        std::__cxx11::string::push_back('\0');
      }
    }
    else if (bVar1 == 0x7b) {
      bVar33 = ((byte *)text)[1] == 0x2a;
      if (!bVar33) {
        if (((local_128->field_0x59 & 0x40) == 0) && (uVar25 == local_128->nargs_pos)) {
          std::__cxx11::string::append((char *)&local_100);
        }
        paVar30 = (local_128->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((uVar25 < (ulong)((long)(local_128->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5
                              )) && (*(long *)(paVar30 + uVar25 * 0x20) != 0)) ||
           ((uVar25 == 0 && ((local_128->field_0x59 & 0x10) != 0)))) {
          std::__cxx11::string::append((char *)&local_100);
        }
        else {
          __val_00 = uVar25 - ((*(ushort *)&local_128->field_0x59 >> 4 & 1) != 0);
          cVar28 = '\x01';
          if (9 < __val_00) {
            uVar22 = __val_00;
            cVar6 = '\x04';
            do {
              cVar28 = cVar6;
              if (uVar22 < 100) {
                cVar28 = cVar28 + -2;
                goto LAB_0010cc68;
              }
              if (uVar22 < 1000) {
                cVar28 = cVar28 + -1;
                goto LAB_0010cc68;
              }
              if (uVar22 < 10000) goto LAB_0010cc68;
              bVar4 = 99999 < uVar22;
              uVar22 = uVar22 / 10000;
              cVar6 = cVar28 + '\x04';
            } while (bVar4);
            cVar28 = cVar28 + '\x01';
          }
LAB_0010cc68:
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_148,cVar28);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_148._M_dataplus._M_p,(uint)local_148._M_string_length,__val_00);
          plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x122804);
          local_168._0_8_ = local_158;
          pPVar23 = (PyTypeObject *)(plVar13 + 2);
          if ((PyTypeObject *)*plVar13 == pPVar23) {
            local_158._0_8_ = (pPVar23->ob_base).ob_base.ob_refcnt;
            local_158._8_8_ = plVar13[3];
          }
          else {
            local_158._0_8_ = (pPVar23->ob_base).ob_base.ob_refcnt;
            local_168._0_8_ = (PyObject *)*plVar13;
          }
          local_168._8_8_ = plVar13[1];
          *plVar13 = (long)pPVar23;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_100,local_168._0_8_);
          if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)local_158) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_100);
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0010c859;
      if (((!bVar33) &&
          (paVar30 = (local_128->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          uVar25 < (ulong)((long)(local_128->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5)))
         && (*(long *)(paVar30 + uVar25 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append((char *)&local_100);
        std::__cxx11::string::append((char *)&local_100);
      }
      if (((ulong)local_128->nargs_pos_only != 0) &&
         (uVar25 + 1 == (ulong)local_128->nargs_pos_only)) {
        std::__cxx11::string::append((char *)&local_100);
      }
      if (!bVar33) {
        uVar25 = uVar25 + 1;
      }
    }
LAB_0010cd4c:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((uVar25 != (long)local_60 +
                 (-(ulong)((*(ushort *)&local_128->field_0x59 >> 7 & 1) != 0) -
                 (ulong)(*(ushort *)&local_128->field_0x59 >> 6 & 1))) ||
     ((type_info *)(&local_b8->bf_getbuffer)[(long)local_b0] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup_guard::operator()(&local_a8,local_100._M_dataplus._M_p);
  pfVar29 = local_128;
  local_128->signature = pcVar9;
  if ((local_128->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_128->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)local_58);
  }
  pfVar29->nargs = (uint16_t)local_60;
  pPVar16 = (pfVar29->sibling).m_ptr;
  if ((pPVar16 != (PyObject *)0x0) && (pPVar16->ob_type == (PyTypeObject *)&PyInstanceMethod_Type))
  {
    (pfVar29->sibling).m_ptr = (PyObject *)pPVar16[1].ob_refcnt;
  }
  pPVar16 = (pfVar29->sibling).m_ptr;
  if (pPVar16 == (PyObject *)0x0) {
LAB_0010ce85:
    pfVar26 = (function_record *)0x0;
  }
  else {
    pPVar23 = pPVar16->ob_type;
    if ((pPVar23 != (PyTypeObject *)&PyCFunction_Type) &&
       (iVar7 = PyType_IsSubtype(pPVar23,&PyCFunction_Type), iVar7 == 0)) {
      if (((pfVar29->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*pfVar29->name != '_')) {
        std::__cxx11::string::string((string *)&local_120,pfVar29->name,(allocator *)&local_88);
        std::operator+(&local_148,"Cannot overload existing non-function object \"",&local_120);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_148);
        local_168._0_8_ = *plVar13;
        pPVar16 = (PyObject *)(plVar13 + 2);
        if ((PyObject *)local_168._0_8_ == pPVar16) {
          local_158._0_8_ = pPVar16->ob_refcnt;
          local_158._8_8_ = plVar13[3];
          local_168._0_8_ = (PyObject *)local_158;
        }
        else {
          local_158._0_8_ = pPVar16->ob_refcnt;
        }
        local_168._8_8_ = plVar13[1];
        *plVar13 = (long)pPVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        pybind11_fail((string *)local_168);
      }
      goto LAB_0010ce85;
    }
    pPVar16 = (pfVar29->sibling).m_ptr;
    if ((*(byte *)(pPVar16[1].ob_refcnt + 0x10) & 0x20) == 0) {
      hVar17.m_ptr = (PyObject *)pPVar16[1].ob_type;
    }
    else {
      hVar17.m_ptr = (PyObject *)0x0;
    }
    if (((PyTypeObject *)hVar17.m_ptr == (PyTypeObject *)0x0) ||
       ((hVar17.m_ptr)->ob_type != (PyTypeObject *)&PyCapsule_Type)) goto LAB_0010ce85;
    if ((PyTypeObject *)hVar17.m_ptr != (PyTypeObject *)0x0) {
      (((PyVarObject *)&(hVar17.m_ptr)->ob_refcnt)->ob_base).ob_refcnt =
           (((PyVarObject *)&(hVar17.m_ptr)->ob_refcnt)->ob_base).ob_refcnt + 1;
    }
    local_168._0_8_ = hVar17.m_ptr;
    pcVar9 = capsule::name((capsule *)local_168);
    if (pcVar9 == (char *)0x0) {
      pfVar19 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_168);
      pfVar26 = (function_record *)0x0;
      if ((pfVar19->scope).m_ptr == (pfVar29->scope).m_ptr) {
        pfVar26 = pfVar19;
      }
    }
    else {
      pfVar26 = (function_record *)0x0;
    }
    object::~object((object *)local_168);
  }
  if (pfVar26 == (function_record *)0x0) {
    pPVar14 = (PyMethodDef *)operator_new(0x20);
    *(undefined8 *)&pPVar14->ml_flags = 0;
    pPVar14->ml_doc = (char *)0x0;
    pPVar14->ml_name = (char *)0x0;
    pPVar14->ml_meth = (PyCFunction)0x0;
    pfVar29->def = pPVar14;
    *(undefined8 *)&pPVar14->ml_flags = 0;
    pPVar14->ml_doc = (char *)0x0;
    pPVar14->ml_name = (char *)0x0;
    pPVar14->ml_meth = (PyCFunction)0x0;
    pPVar14 = pfVar29->def;
    pPVar14->ml_name = pfVar29->name;
    pPVar14->ml_meth = dispatcher;
    pPVar14->ml_flags = 3;
    uVar3._M_t.
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
           *)local_68;
    *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
      *)local_68 = (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                    )0x0;
    capsule::capsule((capsule *)&local_148,
                     (void *)uVar3._M_t.
                             super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                             .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                             _M_head_impl,initialize_generic::anon_class_1_0_00000001::__invoke);
    capsule::set_name((capsule *)&local_148,(char *)0x0);
    if (local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_120._M_dataplus._M_p = (pointer)0x0;
    pPVar16 = (pfVar29->scope).m_ptr;
    if (pPVar16 != (PyObject *)0x0) {
      iVar7 = PyObject_HasAttrString(pPVar16,"__module__");
      if (iVar7 == 1) {
        local_168._8_8_ = (pfVar29->scope).m_ptr;
        local_158._0_8_ = "__module__";
        local_158._8_8_ = 0;
        poVar15 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_168);
      }
      else {
        iVar7 = PyObject_HasAttrString((pfVar29->scope).m_ptr,"__name__");
        if (iVar7 != 1) goto LAB_0010d0b7;
        local_168._8_8_ = (pfVar29->scope).m_ptr;
        local_158._0_8_ = "__name__";
        local_158._8_8_ = 0;
        poVar15 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_168);
      }
      local_88._0_8_ = (poVar15->super_handle).m_ptr;
      if ((PyObject *)local_88._0_8_ != (PyObject *)0x0) {
        ((PyObject *)local_88._0_8_)->ob_refcnt = ((PyObject *)local_88._0_8_)->ob_refcnt + 1;
      }
      object::operator=((object *)&local_120,(object *)&local_88);
      object::~object((object *)&local_88);
      object::~object((object *)(local_158 + 8));
    }
LAB_0010d0b7:
    pPVar16 = (PyObject *)
              PyCMethod_New(pfVar29->def,local_148._M_dataplus._M_p,local_120._M_dataplus._M_p,0);
    (local_c0->super_function).super_object.super_handle.m_ptr = pPVar16;
    if (pPVar16 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    object::~object((object *)&local_120);
    this_01 = &local_148;
  }
  else {
    pPVar16 = (pfVar29->sibling).m_ptr;
    (local_c0->super_function).super_object.super_handle.m_ptr = pPVar16;
    if (pPVar16 != (PyObject *)0x0) {
      pPVar16->ob_refcnt = pPVar16->ob_refcnt + 1;
    }
    if (((*(ushort *)&pfVar26->field_0x59 ^ *(ushort *)&pfVar29->field_0x59) & 0x10) != 0) {
      pybind11_fail(
                   "overloading a method with both static and instance methods is not supported; #define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more details"
                   );
    }
    pfVar19 = pfVar26;
    if ((*(ushort *)&pfVar29->field_0x59 >> 8 & 1) == 0) {
      do {
        pfVar24 = pfVar19;
        pfVar19 = pfVar24->next;
      } while (pfVar19 != (function_record *)0x0);
      uVar3._M_t.
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
             *)local_68;
      *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        *)local_68 = (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                      )0x0;
      pfVar24->next =
           (function_record *)
           uVar3._M_t.
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      pfVar19 = pfVar26;
      if (local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      goto LAB_0010d0f7;
    }
    pfVar29->next = pfVar26;
    local_168._0_8_ = pPVar16[1].ob_type;
    if ((PyTypeObject *)local_168._0_8_ != (PyTypeObject *)0x0) {
      (((PyVarObject *)&((PyObject *)local_168._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
           (((PyVarObject *)&((PyObject *)local_168._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
    }
    uVar3._M_t.
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
           *)local_68;
    *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
      *)local_68 = (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                    )0x0;
    capsule::set_pointer
              ((capsule *)local_168,
               (void *)uVar3._M_t.
                       super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
    if (local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
    }
  }
  object::~object((object *)this_01);
  pfVar19 = pfVar29;
LAB_0010d0f7:
  hVar17.m_ptr = (PyObject *)local_158;
  local_168._8_8_ = (PyObject *)0x0;
  local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
  local_168._0_8_ = hVar17.m_ptr;
  if ((pfVar26 != (function_record *)0x0) && (DAT_0012f5b9 == '\x01')) {
    std::__cxx11::string::append(local_168);
    std::__cxx11::string::append(local_168);
    hVar17.m_ptr = (PyObject *)std::__cxx11::string::append(local_168);
  }
  uVar31 = 0;
  local_b8 = (PyBufferProcs *)
             CONCAT44(local_b8._4_4_,(int)CONCAT71((int7)((ulong)hVar17.m_ptr >> 8),1));
  local_b0 = pfVar26;
  do {
    cVar28 = (char)local_168;
    if (DAT_0012f5b9 == '\x01') {
      if (0 < (int)uVar31) {
        std::__cxx11::string::push_back(cVar28);
      }
      if (pfVar26 != (function_record *)0x0) {
        uVar31 = uVar31 + 1;
        __val = -uVar31;
        if (0 < (int)uVar31) {
          __val = uVar31;
        }
        __len = 1;
        if (9 < __val) {
          uVar25 = (ulong)__val;
          uVar5 = 4;
          do {
            __len = uVar5;
            uVar8 = (uint)uVar25;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_0010d1ea;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_0010d1ea;
            }
            if (uVar8 < 10000) goto LAB_0010d1ea;
            uVar25 = uVar25 / 10000;
            uVar5 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_0010d1ea:
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_120,(char)__len - (char)((int)uVar31 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_120._M_dataplus._M_p + (uVar31 >> 0x1f),__len,__val);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        pfVar26 = local_b0;
        pfVar29 = local_128;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar21 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar21) {
          local_148.field_2._M_allocated_capacity = *puVar21;
          local_148.field_2._8_8_ = puVar12[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar21;
          local_148._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_148._M_string_length = puVar12[1];
        *puVar12 = puVar21;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::_M_append(local_168,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append(local_168);
      std::__cxx11::string::append(local_168);
      std::__cxx11::string::push_back(cVar28);
    }
    if (((pfVar19->doc != (char *)0x0) && (*pfVar19->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (DAT_0012f5b9 == '\0') {
        if (((ulong)local_b8 & 1) == 0) {
          std::__cxx11::string::push_back(cVar28);
        }
        else {
          local_b8 = (PyBufferProcs *)((ulong)local_b8 & 0xffffffff00000000);
        }
      }
      if (DAT_0012f5b9 == '\x01') {
        std::__cxx11::string::push_back(cVar28);
      }
      std::__cxx11::string::append(local_168);
      if (DAT_0012f5b9 == '\x01') {
        std::__cxx11::string::push_back(cVar28);
      }
    }
    pfVar19 = pfVar19->next;
    if (pfVar19 == (function_record *)0x0) {
      pPVar16 = (local_c0->super_function).super_object.super_handle.m_ptr;
      free(*(void **)(pPVar16[1].ob_refcnt + 0x18));
      if ((PyObject *)local_168._8_8_ == (PyObject *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = strdup((char *)local_168._0_8_);
      }
      *(char **)(pPVar16[1].ob_refcnt + 0x18) = pcVar9;
      if ((pfVar29->field_0x59 & 0x10) != 0) {
        pPVar18 = (PyObject *)
                  PyInstanceMethod_New((local_c0->super_function).super_object.super_handle.m_ptr);
        (local_c0->super_function).super_object.super_handle.m_ptr = pPVar18;
        if (pPVar18 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar16->ob_refcnt = pPVar16->ob_refcnt + -1;
        if (pPVar16->ob_refcnt == 0) {
          _Py_Dealloc(pPVar16);
        }
      }
      if ((PyObject *)local_168._0_8_ != (PyObject *)local_158) {
        operator_delete((void *)local_168._0_8_,local_158._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      strdup_guard::~strdup_guard(&local_a8);
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            rec_capsule.set_name(detail::get_function_record_capsule_name());
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }